

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *os,ErrorReason reason)

{
  ErrorReason reason_local;
  ostream *os_local;
  
  switch(reason) {
  case SelfSupertype:
    os_local = std::operator<<(os,"Heap type is a supertype of itself");
    break;
  case InvalidSupertype:
    os_local = std::operator<<(os,"Heap type has an invalid supertype");
    break;
  case ForwardSupertypeReference:
    os_local = std::operator<<(os,"Heap type has an undeclared supertype");
    break;
  case ForwardChildReference:
    os_local = std::operator<<(os,"Heap type has an undeclared child");
    break;
  case InvalidFuncType:
    os_local = std::operator<<(os,"Continuation has invalid function type");
    break;
  case InvalidUnsharedField:
    os_local = std::operator<<(os,"Heap type has an invalid unshared field");
    break;
  case NonStructDescribes:
    os_local = std::operator<<(os,"Describes clause on a non-struct type");
    break;
  case ForwardDescribesReference:
    os_local = std::operator<<(os,"Describes clause is a forward reference");
    break;
  case MismatchedDescribes:
    os_local = std::operator<<(os,"Described type is not a matching descriptor");
    break;
  case NonStructDescriptor:
    os_local = std::operator<<(os,"Descriptor clause on a non-struct type");
    break;
  case MismatchedDescriptor:
    os_local = std::operator<<(os,"Descriptor type does not describe heap type");
    break;
  case InvalidUnsharedDescriptor:
    os_local = std::operator<<(os,"Heap type has an invalid unshared descriptor");
    break;
  case InvalidUnsharedDescribes:
    os_local = std::operator<<(os,"Heap type describes an invalid unshared type");
    break;
  default:
    handle_unreachable("Unexpected error reason",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x5cc);
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, TypeBuilder::ErrorReason reason) {
  switch (reason) {
    case TypeBuilder::ErrorReason::SelfSupertype:
      return os << "Heap type is a supertype of itself";
    case TypeBuilder::ErrorReason::InvalidSupertype:
      return os << "Heap type has an invalid supertype";
    case TypeBuilder::ErrorReason::ForwardSupertypeReference:
      return os << "Heap type has an undeclared supertype";
    case TypeBuilder::ErrorReason::ForwardChildReference:
      return os << "Heap type has an undeclared child";
    case TypeBuilder::ErrorReason::InvalidFuncType:
      return os << "Continuation has invalid function type";
    case TypeBuilder::ErrorReason::InvalidUnsharedField:
      return os << "Heap type has an invalid unshared field";
    case TypeBuilder::ErrorReason::NonStructDescribes:
      return os << "Describes clause on a non-struct type";
    case TypeBuilder::ErrorReason::ForwardDescribesReference:
      return os << "Describes clause is a forward reference";
    case TypeBuilder::ErrorReason::MismatchedDescribes:
      return os << "Described type is not a matching descriptor";
    case TypeBuilder::ErrorReason::NonStructDescriptor:
      return os << "Descriptor clause on a non-struct type";
    case TypeBuilder::ErrorReason::MismatchedDescriptor:
      return os << "Descriptor type does not describe heap type";
    case TypeBuilder::ErrorReason::InvalidUnsharedDescriptor:
      return os << "Heap type has an invalid unshared descriptor";
    case TypeBuilder::ErrorReason::InvalidUnsharedDescribes:
      return os << "Heap type describes an invalid unshared type";
  }
  WASM_UNREACHABLE("Unexpected error reason");
}